

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringPutcMethod::StringPutcMethod(StringPutcMethod *this,Compilation *comp)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_62;
  allocator<char> local_61;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_60;
  string local_48;
  Type *local_28;
  Type *pTStack_20;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"putc",&local_61);
  local_28 = comp->intType;
  pTStack_20 = comp->byteType;
  __l._M_len = 2;
  __l._M_array = &local_28;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_60,__l,&local_62);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,&local_48,Function,2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_60,comp->voidType,true,true);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_60);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_00476fa0;
  return;
}

Assistant:

explicit StringPutcMethod(Compilation& comp) :
        SimpleSystemSubroutine("putc", SubroutineKind::Function, 2,
                               {&comp.getIntType(), &comp.getByteType()}, comp.getVoidType(), true,
                               /* isFirstArgLValue */ true) {}